

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# awssyncer.cc
# Opt level: O2

string * GetEnvironmentVariable(string *__return_storage_ptr__,string *name)

{
  char *pcVar1;
  ostream *poVar2;
  allocator local_11;
  
  pcVar1 = getenv((name->_M_dataplus)._M_p);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_11);
    return __return_storage_ptr__;
  }
  poVar2 = Log();
  poVar2 = std::operator<<(poVar2,"Missing environment variable: ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar2);
  abort();
}

Assistant:

static std::string GetEnvironmentVariable(const std::string& name) {
  const char* value = std::getenv(name.c_str());
  if (value == nullptr) {
    Log() << "Missing environment variable: " << name << std::endl;
    std::abort();
  }
  return value;
}